

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O1

GLenum Diligent::UsageToGLUsage(BufferDesc *Desc)

{
  GLenum GVar1;
  string msg;
  string local_28;
  
  GVar1 = 0x88e4;
  switch(Desc->Usage) {
  case USAGE_IMMUTABLE:
  case USAGE_DEFAULT:
  case USAGE_UNIFIED:
    break;
  case USAGE_DYNAMIC:
    GVar1 = 0x88e8;
    break;
  case USAGE_STAGING:
    GVar1 = 0x88e6 - (Desc->CPUAccessFlags & 1);
    break;
  case USAGE_SPARSE:
    FormatString<char[30]>(&local_28,(char (*) [30])"USAGE_SPARSE is not supported");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"UsageToGLUsage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x80);
    goto LAB_003248e1;
  default:
    FormatString<char[14]>(&local_28,(char (*) [14])"Unknown usage");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"UsageToGLUsage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x81);
LAB_003248e1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    GVar1 = 0;
  }
  return GVar1;
}

Assistant:

inline GLenum UsageToGLUsage(const BufferDesc& Desc)
{
    static_assert(USAGE_NUM_USAGES == 6, "Please update this function to handle the new usage type");

    // http://www.informit.com/articles/article.aspx?p=2033340&seqNum=2
    // https://www.khronos.org/registry/OpenGL-Refpages/gl2.1/xhtml/glBufferData.xml
    switch (Desc.Usage)
    {
        // STATIC: The data store contents will be modified once and used many times.
        // STREAM: The data store contents will be modified once and used at MOST a few times.
        // DYNAMIC: The data store contents will be modified repeatedly and used many times.

        // clang-format off
        case USAGE_IMMUTABLE:   return GL_STATIC_DRAW;
        case USAGE_DEFAULT:     return GL_STATIC_DRAW;
        case USAGE_UNIFIED:     return GL_STATIC_DRAW;
        case USAGE_DYNAMIC:     return GL_DYNAMIC_DRAW;
        case USAGE_STAGING:
            if(Desc.CPUAccessFlags & CPU_ACCESS_READ)
                return GL_STATIC_READ;
            else
                return GL_STATIC_COPY;
        case USAGE_SPARSE: UNEXPECTED( "USAGE_SPARSE is not supported" ); return 0;
        default:           UNEXPECTED( "Unknown usage" ); return 0;
            // clang-format on
    }
}